

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void ReportOutput(lemon *lemp)

{
  state *psVar1;
  symbol *psVar2;
  rule *rp;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  long lVar5;
  action *ap;
  ulong uVar6;
  config *pcVar7;
  char buf [20];
  char acStack_48 [24];
  
  __stream = (FILE *)file_open(lemp,".out","wb");
  if (__stream != (FILE *)0x0) {
    if (0 < lemp->nxstate) {
      lVar5 = 0;
      do {
        psVar1 = lemp->sorted[lVar5];
        fprintf(__stream,"State %d:\n",(ulong)(uint)psVar1->statenum);
        for (pcVar7 = (&psVar1->bp)[lemp->basisflag == 0]; pcVar7 != (config *)0x0;
            pcVar7 = (&pcVar7->next)[lemp->basisflag != 0]) {
          if (pcVar7->dot == pcVar7->rp->nrhs) {
            lemon_sprintf(acStack_48,"(%d)",(ulong)(uint)pcVar7->rp->iRule);
            fprintf(__stream,"    %5s ",acStack_48);
          }
          else {
            fwrite("          ",10,1,__stream);
          }
          RulePrint((FILE *)__stream,pcVar7->rp,pcVar7->dot);
          fputc(10,__stream);
        }
        fputc(10,__stream);
        for (ap = psVar1->ap; ap != (action *)0x0; ap = ap->next) {
          iVar3 = PrintAction(ap,(FILE *)__stream,0x1e);
          if (iVar3 != 0) {
            fputc(10,__stream);
          }
        }
        fputc(10,__stream);
        lVar5 = lVar5 + 1;
      } while (lVar5 < lemp->nxstate);
    }
    fwrite("----------------------------------------------------\n",0x35,1,__stream);
    fwrite("Symbols:\n",9,1,__stream);
    fwrite("The first-set of non-terminals is shown after the name.\n\n",0x39,1,__stream);
    if (0 < lemp->nsymbol) {
      uVar6 = 0;
      do {
        psVar2 = lemp->symbols[uVar6];
        fprintf(__stream,"  %3d: %s",uVar6 & 0xffffffff,psVar2->name);
        if (psVar2->type == NONTERMINAL) {
          fputc(0x3a,__stream);
          if (psVar2->lambda != LEMON_FALSE) {
            fwrite(" <lambda>",9,1,__stream);
          }
          if (0 < lemp->nterminal) {
            lVar5 = 0;
            do {
              if ((psVar2->firstset != (char *)0x0) && (psVar2->firstset[lVar5] != '\0')) {
                fprintf(__stream," %s",lemp->symbols[lVar5]->name);
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 < lemp->nterminal);
          }
        }
        if (-1 < psVar2->prec) {
          fprintf(__stream," (precedence=%d)");
        }
        fputc(10,__stream);
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)lemp->nsymbol);
    }
    fwrite("----------------------------------------------------\n",0x35,1,__stream);
    fwrite("Syntax-only Symbols:\n",0x15,1,__stream);
    fwrite("The following symbols never carry semantic content.\n\n",0x35,1,__stream);
    if (0 < lemp->nsymbol) {
      lVar5 = 0;
      iVar3 = 0;
      do {
        psVar2 = lemp->symbols[lVar5];
        if (psVar2->bContent == 0) {
          sVar4 = strlen(psVar2->name);
          if ((0 < iVar3) && (0x4b < (int)sVar4 + iVar3)) {
            fputc(10,__stream);
            iVar3 = 0;
          }
          if (0 < iVar3) {
            fputc(0x20,__stream);
            iVar3 = iVar3 + 1;
          }
          fputs(psVar2->name,__stream);
          iVar3 = iVar3 + (int)sVar4;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < lemp->nsymbol);
      if (0 < iVar3) {
        fputc(10,__stream);
      }
    }
    fwrite("----------------------------------------------------\n",0x35,1,__stream);
    fwrite("Rules:\n",7,1,__stream);
    for (rp = lemp->rule; rp != (rule *)0x0; rp = rp->next) {
      fprintf(__stream,"%4d: ",(ulong)(uint)rp->iRule);
      rule_print((FILE *)__stream,rp);
      fputc(0x2e,__stream);
      psVar2 = rp->precsym;
      if (psVar2 != (symbol *)0x0) {
        fprintf(__stream," [%s precedence=%d]",psVar2->name,(ulong)(uint)psVar2->prec);
      }
      fputc(10,__stream);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void ReportOutput(struct lemon *lemp)
{
  int i, n;
  struct state *stp;
  struct config *cfp;
  struct action *ap;
  struct rule *rp;
  FILE *fp;

  fp = file_open(lemp,".out","wb");
  if( fp==0 ) return;
  for(i=0; i<lemp->nxstate; i++){
    stp = lemp->sorted[i];
    fprintf(fp,"State %d:\n",stp->statenum);
    if( lemp->basisflag ) cfp=stp->bp;
    else                  cfp=stp->cfp;
    while( cfp ){
      char buf[20];
      if( cfp->dot==cfp->rp->nrhs ){
        lemon_sprintf(buf,"(%d)",cfp->rp->iRule);
        fprintf(fp,"    %5s ",buf);
      }else{
        fprintf(fp,"          ");
      }
      ConfigPrint(fp,cfp);
      fprintf(fp,"\n");
#if 0
      SetPrint(fp,cfp->fws,lemp);
      PlinkPrint(fp,cfp->fplp,"To  ");
      PlinkPrint(fp,cfp->bplp,"From");
#endif
      if( lemp->basisflag ) cfp=cfp->bp;
      else                  cfp=cfp->next;
    }
    fprintf(fp,"\n");
    for(ap=stp->ap; ap; ap=ap->next){
      if( PrintAction(ap,fp,30) ) fprintf(fp,"\n");
    }
    fprintf(fp,"\n");
  }
  fprintf(fp, "----------------------------------------------------\n");
  fprintf(fp, "Symbols:\n");
  fprintf(fp, "The first-set of non-terminals is shown after the name.\n\n");
  for(i=0; i<lemp->nsymbol; i++){
    int j;
    struct symbol *sp;

    sp = lemp->symbols[i];
    fprintf(fp, "  %3d: %s", i, sp->name);
    if( sp->type==NONTERMINAL ){
      fprintf(fp, ":");
      if( sp->lambda ){
        fprintf(fp, " <lambda>");
      }
      for(j=0; j<lemp->nterminal; j++){
        if( sp->firstset && SetFind(sp->firstset, j) ){
          fprintf(fp, " %s", lemp->symbols[j]->name);
        }
      }
    }
    if( sp->prec>=0 ) fprintf(fp," (precedence=%d)", sp->prec);
    fprintf(fp, "\n");
  }
  fprintf(fp, "----------------------------------------------------\n");
  fprintf(fp, "Syntax-only Symbols:\n");
  fprintf(fp, "The following symbols never carry semantic content.\n\n");
  for(i=n=0; i<lemp->nsymbol; i++){
    int w;
    struct symbol *sp = lemp->symbols[i];
    if( sp->bContent ) continue;
    w = (int)strlen(sp->name);
    if( n>0 && n+w>75 ){
      fprintf(fp,"\n");
      n = 0;
    }
    if( n>0 ){
      fprintf(fp, " ");
      n++;
    }
    fprintf(fp, "%s", sp->name);
    n += w;
  }
  if( n>0 ) fprintf(fp, "\n");
  fprintf(fp, "----------------------------------------------------\n");
  fprintf(fp, "Rules:\n");
  for(rp=lemp->rule; rp; rp=rp->next){
    fprintf(fp, "%4d: ", rp->iRule);
    rule_print(fp, rp);
    fprintf(fp,".");
    if( rp->precsym ){
      fprintf(fp," [%s precedence=%d]",
              rp->precsym->name, rp->precsym->prec);
    }
    fprintf(fp,"\n");
  }
  fclose(fp);
  return;
}